

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictors.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename_00;
  byte bVar1;
  char *filter_00;
  int iVar2;
  uint columns_00;
  uint bits_per_sample_00;
  uint samples_per_pixel_00;
  ostream *poVar3;
  exception *e;
  int local_3c;
  int local_38;
  int bits_per_sample;
  int samples_per_pixel;
  int columns;
  char *filename;
  char *pcStack_20;
  bool encode;
  char *filter;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  filter = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc != 7) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Usage: predictor {png|tiff} {en,de}code filename");
    poVar3 = std::operator<<(poVar3," columns samples-per-pixel bits-per-sample");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  pcStack_20 = argv[1];
  iVar2 = strcmp(argv[2],"encode");
  filename._7_1_ = iVar2 == 0;
  _samples_per_pixel = *(char **)(filter + 0x18);
  bits_per_sample = QUtil::string_to_int(*(char **)(filter + 0x20));
  local_38 = QUtil::string_to_int(*(char **)(filter + 0x28));
  local_3c = QUtil::string_to_int(*(char **)(filter + 0x30));
  filter_00 = pcStack_20;
  bVar1 = filename._7_1_;
  filename_00 = _samples_per_pixel;
  columns_00 = QIntC::to_uint<int>(&bits_per_sample);
  bits_per_sample_00 = QIntC::to_uint<int>(&local_3c);
  samples_per_pixel_00 = QIntC::to_uint<int>(&local_38);
  run(filename_00,filter_00,(bool)(bVar1 & 1),columns_00,bits_per_sample_00,samples_per_pixel_00);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 7) {
        std::cerr << "Usage: predictor {png|tiff} {en,de}code filename"
                  << " columns samples-per-pixel bits-per-sample" << std::endl;
        exit(2);
    }
    char* filter = argv[1];
    bool encode = (strcmp(argv[2], "encode") == 0);
    char* filename = argv[3];
    int columns = QUtil::string_to_int(argv[4]);
    int samples_per_pixel = QUtil::string_to_int(argv[5]);
    int bits_per_sample = QUtil::string_to_int(argv[6]);

    try {
        run(filename,
            filter,
            encode,
            QIntC::to_uint(columns),
            QIntC::to_uint(bits_per_sample),
            QIntC::to_uint(samples_per_pixel));
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
    }
    return 0;
}